

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O1

json_t * parse_value(lex_t *lex,size_t flags,json_error_t *error)

{
  int *value;
  size_t __n;
  bool bVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  json_t *json;
  void *pvVar5;
  json_t *pjVar6;
  size_t sVar7;
  ulong uVar8;
  char *pcVar9;
  char *pcVar10;
  ulong uVar11;
  ulong uVar12;
  
  uVar4 = lex->depth + 1;
  lex->depth = uVar4;
  if (0x800 < uVar4) {
    pcVar9 = "maximum parsing depth reached";
    goto LAB_00106ded;
  }
  iVar2 = lex->token;
  if (iVar2 < 0x100) {
    if (iVar2 == -1) {
      pcVar9 = "invalid token";
      goto LAB_00106ded;
    }
    if (iVar2 == 0x5b) {
      json = json_array();
      if (json != (json_t *)0x0) {
        lex_scan(lex,error);
        if (lex->token != 0x5d) {
          do {
            if (lex->token == 0) goto LAB_00107168;
            pjVar6 = parse_value(lex,flags,error);
            iVar2 = 4;
            if (pjVar6 != (json_t *)0x0) {
              if (pjVar6->refcount != 0xffffffffffffffff) {
                pjVar6->refcount = pjVar6->refcount + 1;
              }
              iVar3 = json_array_append_new(json,pjVar6);
              sVar7 = pjVar6->refcount;
              if (iVar3 == 0) {
                if ((sVar7 != 0xffffffffffffffff) && (pjVar6->refcount = sVar7 - 1, sVar7 - 1 == 0))
                {
                  json_delete(pjVar6);
                }
                lex_scan(lex,error);
                iVar2 = 3;
                if (lex->token == 0x2c) {
                  lex_scan(lex,error);
                  iVar2 = 0;
                }
              }
              else if ((sVar7 != 0xffffffffffffffff) &&
                      (pjVar6->refcount = sVar7 - 1, sVar7 - 1 == 0)) {
                json_delete(pjVar6);
              }
            }
          } while (iVar2 == 0);
          if (iVar2 == 4) {
LAB_00107207:
            if ((json->refcount != 0xffffffffffffffff) &&
               (sVar7 = json->refcount - 1, json->refcount = sVar7, sVar7 == 0)) {
              json_delete(json);
            }
            goto LAB_00107222;
          }
          if (iVar2 == 3) {
LAB_00107168:
            if (lex->token != 0x5d) {
              pcVar9 = "\']\' expected";
LAB_001071fa:
              error_set(error,lex,pcVar9);
              goto LAB_00107207;
            }
          }
        }
        goto LAB_001071a0;
      }
    }
    else {
      if (iVar2 != 0x7b) goto switchD_00106e2b_default;
      json = json_object();
      if (json != (json_t *)0x0) {
        lex_scan(lex,error);
        if (lex->token != 0x7d) {
          do {
            if (lex->token == 0x100) {
              pcVar9 = (lex->value).string.val;
              __n = (lex->value).string.len;
              (lex->value).string.val = (char *)0x0;
              (lex->value).string.len = 0;
              if (pcVar9 != (char *)0x0) {
                pvVar5 = memchr(pcVar9,0,__n);
                if (pvVar5 == (void *)0x0) {
                  if (((flags & 1) == 0) ||
                     (pjVar6 = json_object_get(json,pcVar9), pjVar6 == (json_t *)0x0)) {
                    lex_scan(lex,error);
                    if (lex->token == 0x3a) {
                      lex_scan(lex,error);
                      pjVar6 = parse_value(lex,flags,error);
                      if (pjVar6 == (json_t *)0x0) {
                        jsonp_free(pcVar9);
                      }
                      else {
                        if (pjVar6->refcount != 0xffffffffffffffff) {
                          pjVar6->refcount = pjVar6->refcount + 1;
                        }
                        iVar2 = json_object_set_new_nocheck(json,pcVar9,pjVar6);
                        if (iVar2 == 0) {
                          if ((pjVar6->refcount != 0xffffffffffffffff) &&
                             (sVar7 = pjVar6->refcount - 1, pjVar6->refcount = sVar7, sVar7 == 0)) {
                            json_delete(pjVar6);
                          }
                          jsonp_free(pcVar9);
                          lex_scan(lex,error);
                          iVar2 = 3;
                          if (lex->token == 0x2c) {
                            lex_scan(lex,error);
                            iVar2 = 0;
                          }
                          goto LAB_00106f30;
                        }
                        jsonp_free(pcVar9);
                        if ((pjVar6->refcount != 0xffffffffffffffff) &&
                           (sVar7 = pjVar6->refcount - 1, pjVar6->refcount = sVar7, sVar7 == 0)) {
                          json_delete(pjVar6);
                        }
                      }
                      iVar2 = 4;
                      goto LAB_00106f30;
                    }
                    jsonp_free(pcVar9);
                    pcVar9 = "\':\' expected";
                  }
                  else {
                    jsonp_free(pcVar9);
                    pcVar9 = "duplicate object key";
                  }
                }
                else {
                  jsonp_free(pcVar9);
                  pcVar9 = "NUL byte in object key not supported";
                }
                goto LAB_00106f24;
              }
              iVar2 = 1;
            }
            else {
              pcVar9 = "string or \'}\' expected";
LAB_00106f24:
              error_set(error,lex,pcVar9);
              iVar2 = 4;
            }
LAB_00106f30:
          } while (iVar2 == 0);
          if (iVar2 == 4) goto LAB_00107207;
          if (iVar2 != 3) goto LAB_00107222;
          if (lex->token != 0x7d) {
            pcVar9 = "\'}\' expected";
            goto LAB_001071fa;
          }
        }
        goto LAB_001071a0;
      }
    }
LAB_00107222:
    json = (json_t *)0x0;
    goto LAB_001071a0;
  }
  switch(iVar2) {
  case 0x100:
    value = (int *)(lex->value).string.val;
    json = (json_t *)(lex->value).string.len;
    if ((json < (json_t *)0x7) || (*(int *)((long)value + 3) != 0x3a3a4d45 || *value != 0x454d3a3a))
    {
      if (((flags & 0x10) == 0) && (pvVar5 = memchr(value,0,(size_t)json), pvVar5 != (void *)0x0)) {
        bVar1 = false;
        error_set(error,lex,"\\u0000 is not allowed without JSON_ALLOW_NUL");
      }
      else {
        json = jsonp_stringn_nocheck_own((char *)value,(size_t)json);
        bVar1 = true;
        if (json == (json_t *)0x0) {
          json = (json_t *)0x0;
        }
        else {
          (lex->value).string.val = (char *)0x0;
          (lex->value).string.len = 0;
        }
      }
    }
    else {
      uVar4 = (ulong)((long)&json[-1].refcount + 1U) >> 1;
      pcVar9 = (char *)malloc(uVar4);
      if (pcVar9 == (char *)0x0) {
        bVar1 = false;
      }
      else {
        uVar12 = (long)&json->type + (long)value;
        pcVar10 = pcVar9;
        for (uVar11 = (long)value + 7; uVar11 < uVar12; uVar11 = uVar11 + uVar8) {
          if (uVar11 + 0x20 < uVar12) {
            __isoc99_sscanf(uVar11,
                            "%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx"
                            ,pcVar10,pcVar10 + 1,pcVar10 + 2,pcVar10 + 3,pcVar10 + 4,pcVar10 + 5,
                            pcVar10 + 6,pcVar10 + 7,pcVar10 + 8,pcVar10 + 9,pcVar10 + 10,
                            pcVar10 + 0xb,pcVar10 + 0xc,pcVar10 + 0xd,pcVar10 + 0xe,pcVar10 + 0xf,
                            pcVar10 + 0x10,pcVar10 + 0x11,pcVar10 + 0x12,pcVar10 + 0x13,
                            pcVar10 + 0x14,pcVar10 + 0x15,pcVar10 + 0x16,pcVar10 + 0x17,
                            pcVar10 + 0x18,pcVar10 + 0x19,pcVar10 + 0x1a,pcVar10 + 0x1b,
                            pcVar10 + 0x1c,pcVar10 + 0x1d,pcVar10 + 0x1e,pcVar10 + 0x1f);
            uVar8 = 0x40;
          }
          else {
            __isoc99_sscanf(uVar11,"%02hhx",pcVar10);
            uVar8 = 2;
          }
          pcVar10 = pcVar10 + (uVar8 >> 1);
        }
        json = json_mem_own(pcVar9,uVar4);
        bVar1 = true;
      }
    }
    if (bVar1) break;
    goto LAB_001074c6;
  case 0x101:
    json = json_integer((lex->value).integer);
    break;
  case 0x102:
    json = json_real((lex->value).real);
    break;
  case 0x103:
    json = json_true();
    break;
  case 0x104:
    json = json_false();
    break;
  case 0x105:
    json = json_null();
    break;
  default:
switchD_00106e2b_default:
    pcVar9 = "unexpected token";
LAB_00106ded:
    error_set(error,lex,pcVar9);
    return (json_t *)0x0;
  }
LAB_001071a0:
  if (json == (json_t *)0x0) {
LAB_001074c6:
    json = (json_t *)0x0;
  }
  else {
    lex->depth = lex->depth - 1;
  }
  return json;
}

Assistant:

static json_t *parse_value(lex_t *lex, size_t flags, json_error_t *error)
{
	json_t *json;

	lex->depth++;
	if (lex->depth > JSON_PARSER_MAX_DEPTH) {
		error_set(error, lex, "maximum parsing depth reached");
		return NULL;
	}

	switch (lex->token) {
	case TOKEN_STRING: {
		const char *value = lex->value.string.val;
		size_t len = lex->value.string.len;
		unsigned char * temp, *mem;
		const char *pos;

		if (len >= MEM_TOKEN_LEN && !memcmp(value, MEM_TOKEN, MEM_TOKEN_LEN))
		{
			len = len - MEM_TOKEN_LEN;
			value = value + MEM_TOKEN_LEN;
			mem = temp = malloc(len / 2);
			if (!temp)
				return NULL;

			size_t num_read;
			for (pos = value; pos < value + len; pos += num_read, temp += num_read / 2)
			{
				if (pos + 0x20 < value + len)
				{
					sscanf(pos, 
						"%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx"
						"%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx",
						temp, temp + 1, temp + 2, temp + 3, temp + 4, temp + 5, temp + 6, temp + 7,
						temp + 8, temp + 9, temp + 10, temp + 11, temp + 12, temp + 13, temp + 14, temp + 15,
						temp + 16, temp + 17, temp + 18, temp + 19, temp + 20, temp + 21, temp + 22, temp + 23,
						temp + 24, temp + 25, temp + 26, temp + 27, temp + 28, temp + 29, temp + 30, temp + 31);
					num_read = 0x40;
				}
				else
				{
					sscanf(pos, "%02hhx", temp);
					num_read = 2;
				}
			}
			json = json_mem_own(mem, len / 2);
		}
		else
		{

			if (!(flags & JSON_ALLOW_NUL)) {
				if (memchr(value, '\0', len)) {
					error_set(error, lex, "\\u0000 is not allowed without JSON_ALLOW_NUL");
					return NULL;
				}
			}

			json = jsonp_stringn_nocheck_own(value, len);
			if (json) {
				lex->value.string.val = NULL;
				lex->value.string.len = 0;
			}
		}
		break;
	}

	case TOKEN_INTEGER: {
		json = json_integer(lex->value.integer);
		break;
	}

	case TOKEN_REAL: {
		json = json_real(lex->value.real);
		break;
	}

	case TOKEN_TRUE:
		json = json_true();
		break;

	case TOKEN_FALSE:
		json = json_false();
		break;

	case TOKEN_NULL:
		json = json_null();
		break;

	case '{':
		json = parse_object(lex, flags, error);
		break;

	case '[':
		json = parse_array(lex, flags, error);
		break;

	case TOKEN_INVALID:
		error_set(error, lex, "invalid token");
		return NULL;

	default:
		error_set(error, lex, "unexpected token");
		return NULL;
	}

	if (!json)
		return NULL;

	lex->depth--;
	return json;
}